

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LDForceModifier.cpp
# Opt level: O3

void __thiscall OpenMD::LDForceModifier::modifyForces(LDForceModifier *this)

{
  int iVar1;
  StuntDouble *this_00;
  MomentData *pMVar2;
  Snapshot *pSVar3;
  DataStoragePointer DVar4;
  double dVar5;
  double dVar6;
  Molecule *pMVar7;
  uint i_1;
  int iVar8;
  Molecule *this_01;
  long lVar9;
  undefined8 extraout_RAX;
  undefined8 uVar10;
  Mat3x3d *pMVar11;
  ulong uVar12;
  double (*padVar13) [3];
  double *pdVar14;
  pointer ppSVar15;
  Globals *pGVar16;
  uint i_4;
  double (*padVar17) [3];
  ulong uVar18;
  uint i_2;
  uint j_1;
  double (*padVar19) [3];
  long lVar20;
  double *pdVar21;
  long lVar22;
  byte bVar23;
  double tmp;
  double tmp_4;
  double tmp_5;
  double dVar24;
  double tmp_6;
  double dVar25;
  Vector3d molPos;
  Vector<double,_3U> tmp_1;
  Vector3d omegaBody;
  Vector<double,_3U> result_21;
  Vector<double,_3U> result_5;
  Vector<double,_3U> result_12;
  Vector<double,_3U> result_11;
  Vector<double,_3U> result_13;
  Vector3d frc;
  Vector3d randomForceBody;
  Vector3d vcdBody;
  Vector3d Tb;
  MoleculeIterator i;
  Vector3d frictionTorqueLab;
  Vector3d oldFTB;
  Vector3d oldFFL;
  Vector3d frictionForceBody;
  Vector3d vcdLab;
  Vector3d randomTorqueBody;
  Mat3x3d Atrans;
  Mat3x3d A;
  uint local_4cc;
  double local_4c8 [10];
  double local_478 [4];
  undefined1 local_458 [16];
  double local_448;
  uint local_438;
  undefined4 local_434;
  double local_430;
  double local_428 [4];
  undefined1 local_408 [16];
  double local_3f8;
  double local_3b8 [4];
  double local_398 [4];
  double local_378 [4];
  double local_358 [4];
  double local_338 [4];
  double local_318 [4];
  double local_2f8 [3];
  Molecule *local_2e0;
  pointer local_2d8;
  ulong local_2d0;
  double local_2c8 [4];
  Vector3d local_2a8;
  double local_288 [4];
  double local_268 [4];
  double local_248;
  double dStack_240;
  double local_238;
  undefined8 uStack_230;
  double local_228 [4];
  double local_208 [4];
  LDForceModifier *local_1e8;
  MoleculeIterator local_1e0;
  double local_1d8 [4];
  double local_1b8 [4];
  double local_198 [4];
  double local_178 [4];
  double local_158 [4];
  double local_138 [4];
  Vector3d local_118;
  double local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  double local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  bVar23 = 0;
  uVar12 = 0;
  local_1e0._M_node = (_Base_ptr)0x0;
  local_318[2] = 0.0;
  local_318[0] = 0.0;
  local_318[1] = 0.0;
  local_38 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0.0;
  uStack_60 = 0;
  local_78 = 0.0;
  dStack_70 = 0.0;
  local_b8 = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  local_d8 = 0;
  uStack_d0 = 0;
  local_e8 = 0;
  uStack_e0 = 0;
  local_f8 = 0.0;
  uStack_f0 = 0;
  local_208[2] = 0.0;
  local_208[0] = 0.0;
  local_208[1] = 0.0;
  this_01 = SimInfo::beginMolecule((this->super_ForceModifier).info_,&local_1e0);
  if (this_01 != (Molecule *)0x0) {
    local_4cc = 0;
    uVar12 = 0;
    local_1e8 = this;
    do {
      if (this->sphericalBoundaryConditions_ == true) {
        Molecule::getCom((Vector3d *)local_4c8,this_01);
        dVar5 = 0.0;
        lVar9 = 0;
        do {
          dVar5 = dVar5 + local_4c8[lVar9] * local_4c8[lVar9];
          lVar9 = lVar9 + 1;
        } while (lVar9 != 3);
        if (dVar5 < 0.0) {
          dVar5 = sqrt(dVar5);
          uVar10 = extraout_RAX;
        }
        else {
          dVar5 = SQRT(dVar5);
          uVar10 = 0;
        }
        local_434 = (undefined4)
                    CONCAT71((int7)((ulong)uVar10 >> 8),this->frozenBufferRadius_ < dVar5);
        local_438 = -(uint)(dVar5 <= this->frozenBufferRadius_ &&
                           this->langevinBufferRadius_ < dVar5);
      }
      else {
        local_438 = (uint)CONCAT71((int7)((ulong)this_01 >> 8),1);
        local_434 = 0;
      }
      ppSVar15 = (this_01->integrableObjects_).
                 super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pMVar7 = local_2e0;
      if (ppSVar15 !=
          (this_01->integrableObjects_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        this_00 = *ppSVar15;
        local_2e0 = this_01;
        while (this_00 != (StuntDouble *)0x0) {
          if ((char)local_434 != '\0') {
            iVar8 = StuntDouble::freeze(this_00);
            uVar12 = (ulong)(uint)((int)uVar12 + iVar8);
            this = local_1e8;
          }
          if ((local_438 & 1) != 0) {
            local_430 = this_00->mass_;
            local_2d8 = ppSVar15;
            local_2d0 = uVar12;
            if (this_00->objType_ - otDAtom < 2) {
              padVar13 = (double (*) [3])&local_78;
              StuntDouble::getA((RotMat3x3d *)padVar13,this_00);
              local_4c8[6] = 0.0;
              local_4c8[7] = 0.0;
              local_4c8[4] = 0.0;
              local_4c8[5] = 0.0;
              local_4c8[2] = 0.0;
              local_4c8[3] = 0.0;
              local_4c8[0] = 0.0;
              local_4c8[1] = 0.0;
              local_4c8[8] = 0.0;
              lVar9 = 0;
              padVar17 = (double (*) [3])local_4c8;
              do {
                lVar20 = 0;
                padVar19 = padVar17;
                do {
                  (((SquareMatrix<double,_3> *)*padVar19)->super_RectMatrix<double,_3U,_3U>).data_
                  [0][0] = (((SquareMatrix<double,_3> *)*padVar13)->super_RectMatrix<double,_3U,_3U>
                           ).data_[0][lVar20];
                  lVar20 = lVar20 + 1;
                  padVar19 = padVar19 + 1;
                } while (lVar20 != 3);
                lVar9 = lVar9 + 1;
                padVar17 = (double (*) [3])(*padVar17 + 1);
                padVar13 = padVar13 + 1;
              } while (lVar9 != 3);
              pdVar14 = &local_f8;
              padVar13 = (double (*) [3])local_4c8;
              pdVar21 = pdVar14;
              for (lVar9 = 9; lVar9 != 0; lVar9 = lVar9 + -1) {
                *pdVar21 = (*padVar13)[0];
                padVar13 = (double (*) [3])((long)padVar13 + ((ulong)bVar23 * -2 + 1) * 8);
                pdVar21 = pdVar21 + (ulong)bVar23 * -2 + 1;
              }
              pMVar2 = (this->moments_).
                       super__Vector_base<OpenMD::MomentData_*,_std::allocator<OpenMD::MomentData_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[local_4cc];
              local_4c8[0] = 0.0;
              local_4c8[1] = 0.0;
              local_4c8[2] = 0.0;
              lVar9 = 0;
              do {
                dVar5 = local_4c8[lVar9];
                lVar20 = 0;
                do {
                  dVar5 = dVar5 + pdVar14[lVar20] *
                                  *(double *)
                                   ((long)(pMVar2->rcr).super_Vector<double,_3U>.data_ + lVar20 * 8)
                  ;
                  lVar20 = lVar20 + 1;
                } while (lVar20 != 3);
                local_4c8[lVar9] = dVar5;
                lVar9 = lVar9 + 1;
                pdVar14 = pdVar14 + 3;
              } while (lVar9 != 3);
              local_238 = local_4c8[0];
              uStack_230 = 0;
              local_248 = local_4c8[1];
              dStack_240 = local_4c8[2];
              local_2a8.super_Vector<double,_3U>.data_[2] = 0.0;
              local_2a8.super_Vector<double,_3U>.data_[0] = 0.0;
              local_2a8.super_Vector<double,_3U>.data_[1] = 0.0;
              local_118.super_Vector<double,_3U>.data_[2] = 0.0;
              local_118.super_Vector<double,_3U>.data_[0] = 0.0;
              local_118.super_Vector<double,_3U>.data_[1] = 0.0;
              genRandomForceAndTorque(this,&local_2a8,&local_118,local_4cc);
              local_4c8[0] = 0.0;
              local_4c8[1] = 0.0;
              local_4c8[2] = 0.0;
              pdVar14 = &local_f8;
              lVar9 = 0;
              do {
                dVar5 = local_4c8[lVar9];
                lVar20 = 0;
                do {
                  dVar5 = dVar5 + pdVar14[lVar20] * local_2a8.super_Vector<double,_3U>.data_[lVar20]
                  ;
                  lVar20 = lVar20 + 1;
                } while (lVar20 != 3);
                local_4c8[lVar9] = dVar5;
                dVar24 = local_4c8[2];
                dVar6 = local_4c8[1];
                dVar5 = local_4c8[0];
                lVar9 = lVar9 + 1;
                pdVar14 = pdVar14 + 3;
              } while (lVar9 != 3);
              local_2f8[2] = local_4c8[2];
              local_2f8[0] = local_4c8[0];
              local_2f8[1] = local_4c8[1];
              local_4c8[0] = 0.0;
              local_4c8[1] = 0.0;
              local_4c8[2] = 0.0;
              pdVar14 = &local_f8;
              lVar9 = 0;
              do {
                dVar25 = local_4c8[lVar9];
                lVar20 = 0;
                do {
                  dVar25 = dVar25 + pdVar14[lVar20] *
                                    local_118.super_Vector<double,_3U>.data_[lVar20];
                  lVar20 = lVar20 + 1;
                } while (lVar20 != 3);
                local_4c8[lVar9] = dVar25;
                lVar9 = lVar9 + 1;
                pdVar14 = pdVar14 + 3;
              } while (lVar9 != 3);
              local_2c8[2] = local_4c8[2];
              local_2c8[0] = local_4c8[0];
              local_2c8[1] = local_4c8[1];
              pSVar3 = this_00->snapshotMan_->currentSnapshot_;
              lVar9 = (long)this_00->localIndex_;
              lVar20 = *(long *)((long)&(pSVar3->atomData).force.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                this_00->storage_) + lVar9 * 0x18;
              lVar22 = 0;
              do {
                *(double *)(lVar20 + lVar22 * 8) =
                     local_2f8[lVar22] + *(double *)(lVar20 + lVar22 * 8);
                lVar22 = lVar22 + 1;
              } while (lVar22 != 3);
              local_98._8_4_ = SUB84(local_238,0);
              local_98._0_8_ = -dStack_240;
              local_98._12_4_ = (uint)((ulong)local_238 >> 0x20) ^ 0x80000000;
              local_88 = dStack_240;
              dStack_80 = local_238;
              dVar25 = dVar5 * dStack_240 - dVar24 * local_238;
              local_458._8_4_ = SUB84(dVar25,0);
              local_458._0_8_ = dVar24 * local_248 - dVar6 * dStack_240;
              local_458._12_4_ = (int)((ulong)dVar25 >> 0x20);
              local_a8._8_4_ = SUB84(dStack_240,0);
              local_a8._0_8_ = -local_248;
              local_a8._12_4_ = (uint)((ulong)dStack_240 >> 0x20) ^ 0x80000000;
              local_448 = local_238 * dVar6 - dVar5 * local_248;
              local_408 = ZEXT816(0);
              local_3f8 = 0.0;
              lVar20 = 0;
              do {
                *(double *)(local_408 + lVar20 * 8) =
                     local_2c8[lVar20] + *(double *)(local_458 + lVar20 * 8);
                lVar20 = lVar20 + 1;
              } while (lVar20 != 3);
              local_4c8[2] = local_3f8;
              local_4c8[0] = (double)local_408._0_8_;
              local_4c8[1] = (double)local_408._8_8_;
              lVar20 = lVar9 * 0x18 +
                       *(long *)((long)&(pSVar3->atomData).torque.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                this_00->storage_);
              lVar22 = 0;
              do {
                *(double *)(lVar20 + lVar22 * 8) =
                     local_4c8[lVar22] + *(double *)(lVar20 + lVar22 * 8);
                lVar22 = lVar22 + 1;
              } while (lVar22 != 3);
              local_448 = 0.0;
              local_458 = ZEXT816(0);
              DVar4 = this_00->storage_;
              lVar20 = *(long *)((long)&(pSVar3->atomData).velocity.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + DVar4);
              local_268[2] = *(double *)(lVar20 + 0x10 + lVar9 * 0x18);
              pdVar14 = (double *)(lVar20 + lVar9 * 0x18);
              local_268[0] = *pdVar14;
              local_268[1] = pdVar14[1];
              pSVar3 = this_00->snapshotMan_->currentSnapshot_;
              lVar9 = *(long *)((long)&(pSVar3->atomData).angularMomentum.
                                       super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + DVar4);
              lVar20 = (long)this_00->localIndex_ * 0x18;
              local_428[2] = (double)*(undefined8 *)(lVar9 + 0x10 + lVar20);
              pdVar14 = (double *)(lVar9 + lVar20);
              local_428[0] = *pdVar14;
              local_428[1] = pdVar14[1];
              lVar9 = *(long *)((long)&(pSVar3->atomData).force.
                                       super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + DVar4);
              pdVar14 = (double *)(lVar9 + lVar20);
              local_318[0] = *pdVar14;
              local_318[1] = pdVar14[1];
              local_318[2] = (double)*(undefined8 *)(lVar9 + 0x10 + lVar20);
              dVar5 = this->dt2_;
              local_3f8 = 0.0;
              local_408 = ZEXT816(0);
              lVar9 = 0;
              do {
                *(double *)(local_408 + lVar9 * 8) =
                     local_318[lVar9] * (dVar5 / local_430) * 0.0004184;
                lVar9 = lVar9 + 1;
              } while (lVar9 != 3);
              local_4c8[0] = 0.0;
              local_4c8[1] = 0.0;
              local_4c8[2] = 0.0;
              lVar9 = 0;
              do {
                local_4c8[lVar9] = local_268[lVar9] + *(double *)(local_408 + lVar9 * 8);
                lVar9 = lVar9 + 1;
              } while (lVar9 != 3);
              local_138[2] = local_4c8[2];
              local_138[0] = local_4c8[0];
              local_138[1] = local_4c8[1];
              pMVar11 = (Mat3x3d *)
                        ((long)this_00->localIndex_ * 0x18 +
                        *(long *)((long)&(this_00->snapshotMan_->currentSnapshot_->atomData).torque.
                                         super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start +
                                 this_00->storage_));
              local_408 = ZEXT816(0);
              local_3f8 = 0.0;
              if (pMVar11 != (Mat3x3d *)local_408) {
                lVar9 = 0;
                do {
                  *(double *)(local_408 + lVar9 * 8) =
                       (pMVar11->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                       data_[0][lVar9];
                  lVar9 = lVar9 + 1;
                } while (lVar9 != 3);
              }
              StuntDouble::lab2Body((Vector3d *)local_4c8,this_00,(Vector3d *)local_408);
              local_208[2] = local_4c8[2];
              local_208[0] = local_4c8[0];
              local_208[1] = local_4c8[1];
              dVar5 = this->dt2_;
              local_408 = ZEXT816(0);
              local_3f8 = 0.0;
              lVar9 = 0;
              do {
                *(double *)(local_408 + lVar9 * 8) = local_208[lVar9] * dVar5 * 0.0004184;
                lVar9 = lVar9 + 1;
              } while (lVar9 != 3);
              local_4c8[0] = 0.0;
              local_4c8[1] = 0.0;
              local_4c8[2] = 0.0;
              lVar9 = 0;
              do {
                local_4c8[lVar9] = local_428[lVar9] + *(double *)(local_408 + lVar9 * 8);
                lVar9 = lVar9 + 1;
              } while (lVar9 != 3);
              local_288[2] = local_4c8[2];
              local_288[0] = local_4c8[0];
              local_288[1] = local_4c8[1];
              local_158[2] = 0.0;
              local_158[0] = 0.0;
              local_158[1] = 0.0;
              local_228[2] = 0.0;
              local_228[0] = 0.0;
              local_228[1] = 0.0;
              local_178[2] = 0.0;
              local_178[0] = 0.0;
              local_178[1] = 0.0;
              local_3b8[2] = 0.0;
              local_3b8[0] = 0.0;
              local_3b8[1] = 0.0;
              local_198[2] = 0.0;
              local_198[0] = 0.0;
              local_198[1] = 0.0;
              local_338[2] = 0.0;
              local_338[0] = 0.0;
              local_338[1] = 0.0;
              local_1b8[2] = 0.0;
              local_1b8[0] = 0.0;
              local_1b8[1] = 0.0;
              local_1d8[2] = 0.0;
              local_1d8[0] = 0.0;
              local_1d8[1] = 0.0;
              if (0 < this->maxIterNum_) {
                iVar8 = 0;
                do {
                  if (this_00->linear_ == true) {
                    iVar1 = this_00->linearAxis_;
                    uVar18 = (ulong)(((iVar1 + 1) / 3) * -3 + iVar1 + 1);
                    pMVar2 = (this->moments_).
                             super__Vector_base<OpenMD::MomentData_*,_std::allocator<OpenMD::MomentData_*>_>
                             ._M_impl.super__Vector_impl_data._M_start[local_4cc];
                    uVar12 = (ulong)(iVar1 + ((iVar1 + 2) / 3) * -3 + 2);
                    *(double *)(local_458 + uVar18 * 8) =
                         local_288[uVar18] /
                         *(double *)
                          ((long)&(pMVar2->Icr).super_SquareMatrix<double,_3>.
                                  super_RectMatrix<double,_3U,_3U> + uVar18 * 0x20);
                    *(double *)(local_458 + uVar12 * 8) =
                         local_288[uVar12] /
                         *(double *)
                          ((long)&(pMVar2->Icr).super_SquareMatrix<double,_3>.
                                  super_RectMatrix<double,_3U,_3U> + uVar12 * 0x20);
                  }
                  else {
                    pMVar11 = &(this->moments_).
                               super__Vector_base<OpenMD::MomentData_*,_std::allocator<OpenMD::MomentData_*>_>
                               ._M_impl.super__Vector_impl_data._M_start[local_4cc]->IcrInv;
                    local_4c8[0] = 0.0;
                    local_4c8[1] = 0.0;
                    local_4c8[2] = 0.0;
                    lVar9 = 0;
                    do {
                      dVar5 = local_4c8[lVar9];
                      lVar20 = 0;
                      do {
                        dVar5 = dVar5 + *(double *)
                                         ((long)(pMVar11->super_SquareMatrix<double,_3>).
                                                super_RectMatrix<double,_3U,_3U>.data_ + lVar20 * 8)
                                        * local_288[lVar20];
                        lVar20 = lVar20 + 1;
                      } while (lVar20 != 3);
                      local_4c8[lVar9] = dVar5;
                      lVar9 = lVar9 + 1;
                      pMVar11 = (Mat3x3d *)
                                ((long)(pMVar11->super_SquareMatrix<double,_3>).
                                       super_RectMatrix<double,_3U,_3U>.data_ + 0x18);
                    } while (lVar9 != 3);
                    local_448 = local_4c8[2];
                    local_458._8_8_ = local_4c8[1];
                    local_458._0_8_ = local_4c8[0];
                  }
                  local_4c8[0] = 0.0;
                  local_4c8[1] = 0.0;
                  local_4c8[2] = 0.0;
                  pdVar14 = &local_f8;
                  lVar9 = 0;
                  do {
                    dVar5 = local_4c8[lVar9];
                    lVar20 = 0;
                    do {
                      dVar5 = dVar5 + pdVar14[lVar20] * *(double *)(local_458 + lVar20 * 8);
                      lVar20 = lVar20 + 1;
                    } while (lVar20 != 3);
                    local_4c8[lVar9] = dVar5;
                    lVar9 = lVar9 + 1;
                    pdVar14 = pdVar14 + 3;
                  } while (lVar9 != 3);
                  dVar5 = local_4c8[2] * dStack_80 - local_4c8[0] * dStack_240;
                  local_408._8_4_ = SUB84(dVar5,0);
                  local_408._0_8_ = local_4c8[1] * local_88 - local_4c8[2] * local_248;
                  local_408._12_4_ = (int)((ulong)dVar5 >> 0x20);
                  local_3f8 = local_4c8[0] * local_248 - local_238 * local_4c8[1];
                  local_4c8[0] = 0.0;
                  local_4c8[1] = 0.0;
                  local_4c8[2] = 0.0;
                  lVar9 = 0;
                  do {
                    local_4c8[lVar9] = local_138[lVar9] + *(double *)(local_408 + lVar9 * 8);
                    lVar9 = lVar9 + 1;
                  } while (lVar9 != 3);
                  local_158[2] = local_4c8[2];
                  local_158[0] = local_4c8[0];
                  local_158[1] = local_4c8[1];
                  local_4c8[0] = 0.0;
                  local_4c8[1] = 0.0;
                  local_4c8[2] = 0.0;
                  pdVar14 = &local_78;
                  lVar9 = 0;
                  do {
                    dVar5 = local_4c8[lVar9];
                    lVar20 = 0;
                    do {
                      dVar5 = dVar5 + pdVar14[lVar20] * local_158[lVar20];
                      lVar20 = lVar20 + 1;
                    } while (lVar20 != 3);
                    local_4c8[lVar9] = dVar5;
                    lVar9 = lVar9 + 1;
                    pdVar14 = pdVar14 + 3;
                  } while (lVar9 != 3);
                  local_228[2] = local_4c8[2];
                  local_228[0] = local_4c8[0];
                  local_228[1] = local_4c8[1];
                  HydroProp::getXitt((Mat3x3d *)local_4c8,
                                     (this->hydroProps_).
                                     super__Vector_base<OpenMD::HydroProp_*,_std::allocator<OpenMD::HydroProp_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start[local_4cc]);
                  local_378[0] = 0.0;
                  local_378[1] = 0.0;
                  local_378[2] = 0.0;
                  lVar9 = 0;
                  padVar13 = (double (*) [3])local_4c8;
                  do {
                    dVar5 = local_378[lVar9];
                    lVar20 = 0;
                    do {
                      dVar5 = dVar5 + (*padVar13)[lVar20] * local_228[lVar20];
                      lVar20 = lVar20 + 1;
                    } while (lVar20 != 3);
                    local_378[lVar9] = dVar5;
                    lVar9 = lVar9 + 1;
                    padVar13 = padVar13 + 1;
                  } while (lVar9 != 3);
                  HydroProp::getXirt((Mat3x3d *)local_408,
                                     (this->hydroProps_).
                                     super__Vector_base<OpenMD::HydroProp_*,_std::allocator<OpenMD::HydroProp_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start[local_4cc]);
                  local_398[0] = 0.0;
                  local_398[1] = 0.0;
                  local_398[2] = 0.0;
                  lVar9 = 0;
                  padVar13 = (double (*) [3])local_408;
                  do {
                    dVar5 = local_398[lVar9];
                    lVar20 = 0;
                    do {
                      dVar5 = dVar5 + (((SquareMatrix<double,_3> *)*padVar13)->
                                      super_RectMatrix<double,_3U,_3U>).data_[0][lVar20] *
                                      *(double *)(local_458 + lVar20 * 8);
                      lVar20 = lVar20 + 1;
                    } while (lVar20 != 3);
                    local_398[lVar9] = dVar5;
                    lVar9 = lVar9 + 1;
                    padVar13 = padVar13 + 1;
                  } while (lVar9 != 3);
                  local_358[0] = 0.0;
                  local_358[1] = 0.0;
                  local_358[2] = 0.0;
                  lVar9 = 0;
                  do {
                    local_358[lVar9] = local_378[lVar9] + local_398[lVar9];
                    lVar9 = lVar9 + 1;
                  } while (lVar9 != 3);
                  local_478[2] = local_358[2];
                  local_478[0] = local_358[0];
                  local_478[1] = local_358[1];
                  lVar9 = 0;
                  do {
                    local_478[lVar9] = -local_478[lVar9];
                    lVar9 = lVar9 + 1;
                  } while (lVar9 != 3);
                  local_178[2] = local_478[2];
                  local_178[0] = local_478[0];
                  local_178[1] = local_478[1];
                  local_198[0] = local_3b8[0];
                  local_198[1] = local_3b8[1];
                  local_198[2] = local_3b8[2];
                  local_4c8[0] = 0.0;
                  local_4c8[1] = 0.0;
                  local_4c8[2] = 0.0;
                  pdVar14 = &local_f8;
                  lVar9 = 0;
                  do {
                    dVar5 = local_4c8[lVar9];
                    lVar20 = 0;
                    do {
                      dVar5 = dVar5 + pdVar14[lVar20] * local_178[lVar20];
                      lVar20 = lVar20 + 1;
                    } while (lVar20 != 3);
                    local_4c8[lVar9] = dVar5;
                    lVar9 = lVar9 + 1;
                    pdVar14 = pdVar14 + 3;
                  } while (lVar9 != 3);
                  local_3b8[2] = local_4c8[2];
                  local_3b8[0] = local_4c8[0];
                  local_3b8[1] = local_4c8[1];
                  local_1b8[0] = local_338[0];
                  local_1b8[1] = local_338[1];
                  local_1b8[2] = local_338[2];
                  HydroProp::getXitr((Mat3x3d *)local_4c8,
                                     (this->hydroProps_).
                                     super__Vector_base<OpenMD::HydroProp_*,_std::allocator<OpenMD::HydroProp_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start[local_4cc]);
                  local_378[0] = 0.0;
                  local_378[1] = 0.0;
                  local_378[2] = 0.0;
                  lVar9 = 0;
                  padVar13 = (double (*) [3])local_4c8;
                  do {
                    dVar5 = local_378[lVar9];
                    lVar20 = 0;
                    do {
                      dVar5 = dVar5 + (*padVar13)[lVar20] * local_228[lVar20];
                      lVar20 = lVar20 + 1;
                    } while (lVar20 != 3);
                    local_378[lVar9] = dVar5;
                    lVar9 = lVar9 + 1;
                    padVar13 = padVar13 + 1;
                  } while (lVar9 != 3);
                  HydroProp::getXirr((Mat3x3d *)local_408,
                                     (this->hydroProps_).
                                     super__Vector_base<OpenMD::HydroProp_*,_std::allocator<OpenMD::HydroProp_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start[local_4cc]);
                  local_398[0] = 0.0;
                  local_398[1] = 0.0;
                  local_398[2] = 0.0;
                  lVar9 = 0;
                  padVar13 = (double (*) [3])local_408;
                  do {
                    dVar5 = local_398[lVar9];
                    lVar20 = 0;
                    do {
                      dVar5 = dVar5 + (*padVar13)[lVar20] * *(double *)(local_458 + lVar20 * 8);
                      lVar20 = lVar20 + 1;
                    } while (lVar20 != 3);
                    local_398[lVar9] = dVar5;
                    lVar9 = lVar9 + 1;
                    padVar13 = padVar13 + 1;
                  } while (lVar9 != 3);
                  local_358[0] = 0.0;
                  local_358[1] = 0.0;
                  local_358[2] = 0.0;
                  lVar9 = 0;
                  do {
                    local_358[lVar9] = local_378[lVar9] + local_398[lVar9];
                    lVar9 = lVar9 + 1;
                  } while (lVar9 != 3);
                  local_478[2] = local_358[2];
                  local_478[0] = local_358[0];
                  local_478[1] = local_358[1];
                  lVar9 = 0;
                  do {
                    local_478[lVar9] = -local_478[lVar9];
                    lVar9 = lVar9 + 1;
                  } while (lVar9 != 3);
                  local_338[2] = local_478[2];
                  local_338[0] = local_478[0];
                  local_338[1] = local_478[1];
                  local_4c8[0] = 0.0;
                  local_4c8[1] = 0.0;
                  local_4c8[2] = 0.0;
                  pdVar14 = &local_f8;
                  lVar9 = 0;
                  do {
                    dVar5 = local_4c8[lVar9];
                    lVar20 = 0;
                    do {
                      dVar5 = dVar5 + pdVar14[lVar20] * local_338[lVar20];
                      lVar20 = lVar20 + 1;
                    } while (lVar20 != 3);
                    local_4c8[lVar9] = dVar5;
                    lVar9 = lVar9 + 1;
                    pdVar14 = pdVar14 + 3;
                  } while (lVar9 != 3);
                  local_1d8[2] = local_4c8[2];
                  local_1d8[0] = local_4c8[0];
                  local_1d8[1] = local_4c8[1];
                  dVar5 = this->dt2_;
                  local_478[0] = 0.0;
                  local_478[1] = 0.0;
                  local_478[2] = 0.0;
                  lVar9 = 0;
                  do {
                    local_478[lVar9] = local_318[lVar9] + local_3b8[lVar9];
                    lVar9 = lVar9 + 1;
                  } while (lVar9 != 3);
                  local_408 = ZEXT816(0);
                  local_3f8 = 0.0;
                  lVar9 = 0;
                  do {
                    *(double *)(local_408 + lVar9 * 8) =
                         local_478[lVar9] * (dVar5 / local_430) * 0.0004184;
                    lVar9 = lVar9 + 1;
                  } while (lVar9 != 3);
                  local_4c8[0] = 0.0;
                  local_4c8[1] = 0.0;
                  local_4c8[2] = 0.0;
                  lVar9 = 0;
                  do {
                    local_4c8[lVar9] = local_268[lVar9] + *(double *)(local_408 + lVar9 * 8);
                    lVar9 = lVar9 + 1;
                  } while (lVar9 != 3);
                  local_138[2] = local_4c8[2];
                  local_138[0] = local_4c8[0];
                  local_138[1] = local_4c8[1];
                  local_478[0] = 0.0;
                  local_478[1] = 0.0;
                  local_478[2] = 0.0;
                  lVar9 = 0;
                  do {
                    local_478[lVar9] = local_208[lVar9] + local_338[lVar9];
                    lVar9 = lVar9 + 1;
                  } while (lVar9 != 3);
                  local_408 = ZEXT816(0);
                  local_3f8 = 0.0;
                  lVar9 = 0;
                  do {
                    *(double *)(local_408 + lVar9 * 8) = local_478[lVar9] * dVar5 * 0.0004184;
                    lVar9 = lVar9 + 1;
                  } while (lVar9 != 3);
                  local_4c8[0] = 0.0;
                  local_4c8[1] = 0.0;
                  local_4c8[2] = 0.0;
                  lVar9 = 0;
                  do {
                    local_4c8[lVar9] = local_428[lVar9] + *(double *)(local_408 + lVar9 * 8);
                    lVar9 = lVar9 + 1;
                  } while (lVar9 != 3);
                  local_288[2] = local_4c8[2];
                  local_288[0] = local_4c8[0];
                  local_288[1] = local_4c8[1];
                  dVar5 = 0.0;
                  lVar9 = 0;
                  do {
                    dVar5 = dVar5 + local_3b8[lVar9] * local_198[lVar9];
                    lVar9 = lVar9 + 1;
                  } while (lVar9 != 3);
                  dVar6 = 0.0;
                  lVar9 = 0;
                  do {
                    dVar6 = dVar6 + local_3b8[lVar9] * local_3b8[lVar9];
                    lVar9 = lVar9 + 1;
                  } while (lVar9 != 3);
                  dVar24 = 0.0;
                  lVar9 = 0;
                  do {
                    dVar24 = dVar24 + local_338[lVar9] * local_1b8[lVar9];
                    lVar9 = lVar9 + 1;
                  } while (lVar9 != 3);
                  dVar25 = 0.0;
                  lVar9 = 0;
                  do {
                    dVar25 = dVar25 + local_338[lVar9] * local_338[lVar9];
                    lVar9 = lVar9 + 1;
                  } while (lVar9 != 3);
                } while (((this->forceTolerance_ < ABS(1.0 - dVar5 / dVar6)) ||
                         (this->forceTolerance_ < ABS(1.0 - dVar24 / dVar25))) &&
                        (iVar8 = iVar8 + 1, iVar8 < this->maxIterNum_));
              }
              lVar9 = (long)this_00->localIndex_ * 0x18 +
                      *(long *)((long)&(this_00->snapshotMan_->currentSnapshot_->atomData).force.
                                       super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + this_00->storage_
                               );
              lVar20 = 0;
              do {
                *(double *)(lVar9 + lVar20 * 8) =
                     local_3b8[lVar20] + *(double *)(lVar9 + lVar20 * 8);
                lVar20 = lVar20 + 1;
              } while (lVar20 != 3);
              local_478[0] = local_248 * local_3b8[2] + (double)local_98._0_8_ * local_3b8[1];
              local_478[1] = dStack_240 * local_3b8[0] + (double)local_98._8_8_ * local_3b8[2];
              local_478[2] = local_a8._0_8_ * local_3b8[0] + local_238 * local_3b8[1];
              local_408 = ZEXT816(0);
              local_3f8 = 0.0;
              lVar9 = 0;
              do {
                *(double *)(local_408 + lVar9 * 8) = local_1d8[lVar9] + local_478[lVar9];
                lVar9 = lVar9 + 1;
              } while (lVar9 != 3);
              local_4c8[2] = local_3f8;
              local_4c8[0] = (double)local_408._0_8_;
              local_4c8[1] = (double)local_408._8_8_;
              lVar9 = (long)this_00->localIndex_ * 0x18 +
                      *(long *)((long)&(this_00->snapshotMan_->currentSnapshot_->atomData).torque.
                                       super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + this_00->storage_
                               );
              lVar20 = 0;
              do {
                *(double *)(lVar9 + lVar20 * 8) =
                     local_4c8[lVar20] + *(double *)(lVar9 + lVar20 * 8);
                lVar20 = lVar20 + 1;
                ppSVar15 = local_2d8;
                this_01 = local_2e0;
                uVar12 = local_2d0;
              } while (lVar20 != 3);
            }
            else {
              local_2a8.super_Vector<double,_3U>.data_[0] = 0.0;
              local_2a8.super_Vector<double,_3U>.data_[1] = 0.0;
              local_2a8.super_Vector<double,_3U>.data_[2] = 0.0;
              genRandomForceAndTorque(this,&local_2a8,&local_118,local_4cc);
              lVar9 = (long)this_00->localIndex_ * 0x18 +
                      *(long *)((long)&(this_00->snapshotMan_->currentSnapshot_->atomData).force.
                                       super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + this_00->storage_
                               );
              lVar20 = 0;
              do {
                *(double *)(lVar9 + lVar20 * 8) =
                     local_2a8.super_Vector<double,_3U>.data_[lVar20] +
                     *(double *)(lVar9 + lVar20 * 8);
                lVar20 = lVar20 + 1;
              } while (lVar20 != 3);
              pSVar3 = this_00->snapshotMan_->currentSnapshot_;
              lVar9 = *(long *)((long)&(pSVar3->atomData).velocity.
                                       super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + this_00->storage_
                               );
              lVar20 = (long)this_00->localIndex_ * 0x18;
              local_2f8[2] = *(double *)(lVar9 + 0x10 + lVar20);
              pdVar14 = (double *)(lVar9 + lVar20);
              local_2f8[0] = *pdVar14;
              local_2f8[1] = pdVar14[1];
              lVar9 = *(long *)((long)&(pSVar3->atomData).force.
                                       super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + this_00->storage_
                               );
              pdVar14 = (double *)(lVar9 + lVar20);
              local_318[0] = *pdVar14;
              local_318[1] = pdVar14[1];
              local_318[2] = (double)*(undefined8 *)(lVar9 + 0x10 + lVar20);
              dVar5 = this->dt2_;
              local_408 = ZEXT816(0);
              local_3f8 = 0.0;
              lVar9 = 0;
              do {
                *(double *)(local_408 + lVar9 * 8) =
                     local_318[lVar9] * (dVar5 / local_430) * 0.0004184;
                lVar9 = lVar9 + 1;
              } while (lVar9 != 3);
              local_4c8[0] = 0.0;
              local_4c8[1] = 0.0;
              local_4c8[2] = 0.0;
              lVar9 = 0;
              do {
                local_4c8[lVar9] = local_2f8[lVar9] + *(double *)(local_408 + lVar9 * 8);
                lVar9 = lVar9 + 1;
              } while (lVar9 != 3);
              local_2c8[2] = local_4c8[2];
              local_2c8[0] = local_4c8[0];
              local_2c8[1] = local_4c8[1];
              local_458 = ZEXT816(0);
              local_448 = 0.0;
              if (0 < this->maxIterNum_) {
                iVar8 = 0;
                do {
                  local_268[2] = local_448;
                  local_268[0] = (double)local_458._0_8_;
                  local_268[1] = (double)local_458._8_8_;
                  local_2c8[0] = local_4c8[0];
                  local_2c8[1] = local_4c8[1];
                  local_2c8[2] = local_4c8[2];
                  HydroProp::getXitt((Mat3x3d *)local_408,
                                     (this->hydroProps_).
                                     super__Vector_base<OpenMD::HydroProp_*,_std::allocator<OpenMD::HydroProp_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start[local_4cc]);
                  padVar13 = (double (*) [3])local_408;
                  padVar17 = (double (*) [3])local_4c8;
                  for (lVar9 = 9; lVar9 != 0; lVar9 = lVar9 + -1) {
                    (*padVar17)[0] = (*padVar13)[0];
                    padVar13 = (double (*) [3])((long)padVar13 + (ulong)bVar23 * -0x10 + 8);
                    padVar17 = (double (*) [3])((long)padVar17 + ((ulong)bVar23 * -2 + 1) * 8);
                  }
                  lVar9 = 0;
                  padVar13 = (double (*) [3])local_4c8;
                  do {
                    lVar20 = 0;
                    do {
                      (*padVar13)[lVar20] = -(*padVar13)[lVar20];
                      lVar20 = lVar20 + 1;
                    } while (lVar20 != 3);
                    lVar9 = lVar9 + 1;
                    padVar13 = padVar13 + 1;
                  } while (lVar9 != 3);
                  local_428[0] = 0.0;
                  local_428[1] = 0.0;
                  local_428[2] = 0.0;
                  lVar9 = 0;
                  padVar13 = (double (*) [3])local_4c8;
                  do {
                    dVar5 = local_428[lVar9];
                    lVar20 = 0;
                    do {
                      dVar5 = dVar5 + (*padVar13)[lVar20] * local_2c8[lVar20];
                      lVar20 = lVar20 + 1;
                    } while (lVar20 != 3);
                    local_428[lVar9] = dVar5;
                    lVar9 = lVar9 + 1;
                    padVar13 = padVar13 + 1;
                  } while (lVar9 != 3);
                  local_448 = local_428[2];
                  local_458._8_8_ = local_428[1];
                  local_458._0_8_ = local_428[0];
                  dVar5 = this->dt2_;
                  local_428[0] = 0.0;
                  local_428[1] = 0.0;
                  local_428[2] = 0.0;
                  lVar9 = 0;
                  do {
                    local_428[lVar9] = local_318[lVar9] + *(double *)(local_458 + lVar9 * 8);
                    lVar9 = lVar9 + 1;
                  } while (lVar9 != 3);
                  local_408 = ZEXT816(0);
                  local_3f8 = 0.0;
                  lVar9 = 0;
                  do {
                    *(double *)(local_408 + lVar9 * 8) =
                         local_428[lVar9] * (dVar5 / local_430) * 0.0004184;
                    lVar9 = lVar9 + 1;
                  } while (lVar9 != 3);
                  local_4c8[0] = 0.0;
                  local_4c8[1] = 0.0;
                  local_4c8[2] = 0.0;
                  lVar9 = 0;
                  do {
                    local_4c8[lVar9] = local_2f8[lVar9] + *(double *)(local_408 + lVar9 * 8);
                    lVar9 = lVar9 + 1;
                  } while (lVar9 != 3);
                  local_2c8[2] = local_4c8[2];
                  local_2c8[0] = local_4c8[0];
                  local_2c8[1] = local_4c8[1];
                  dVar5 = 0.0;
                  lVar9 = 0;
                  do {
                    dVar5 = dVar5 + *(double *)(local_458 + lVar9 * 8) * local_268[lVar9];
                    lVar9 = lVar9 + 1;
                  } while (lVar9 != 3);
                  dVar6 = 0.0;
                  lVar9 = 0;
                  do {
                    dVar6 = dVar6 + *(double *)(local_458 + lVar9 * 8) *
                                    *(double *)(local_458 + lVar9 * 8);
                    lVar9 = lVar9 + 1;
                  } while (lVar9 != 3);
                } while ((this->forceTolerance_ < ABS(1.0 - dVar5 / dVar6)) &&
                        (iVar8 = iVar8 + 1, iVar8 < this->maxIterNum_));
              }
              lVar9 = (long)this_00->localIndex_ * 0x18 +
                      *(long *)((long)&(this_00->snapshotMan_->currentSnapshot_->atomData).force.
                                       super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + this_00->storage_
                               );
              lVar20 = 0;
              do {
                *(double *)(lVar9 + lVar20 * 8) =
                     *(double *)(local_458 + lVar20 * 8) + *(double *)(lVar9 + lVar20 * 8);
                lVar20 = lVar20 + 1;
                ppSVar15 = local_2d8;
                this_01 = local_2e0;
                uVar12 = local_2d0;
                local_4c8[0] = local_2c8[0];
                local_4c8[1] = local_2c8[1];
                local_4c8[2] = local_2c8[2];
              } while (lVar20 != 3);
            }
          }
          local_4cc = local_4cc + 1;
          ppSVar15 = ppSVar15 + 1;
          pMVar7 = local_2e0;
          if (ppSVar15 ==
              (this_01->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) break;
          this_00 = *ppSVar15;
        }
      }
      local_2e0 = pMVar7;
      this_01 = SimInfo::nextMolecule((this->super_ForceModifier).info_,&local_1e0);
    } while (this_01 != (Molecule *)0x0);
  }
  ((this->super_ForceModifier).info_)->fdf_local = (int)uVar12;
  pGVar16 = this->simParams_;
  if ((pGVar16->ConserveLinearMomentum).super_ParameterBase.field_0x2b == '\x01') {
    Velocitizer::removeComDrift
              ((this->veloMunge_)._M_t.
               super___uniq_ptr_impl<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_>
               ._M_t.
               super__Tuple_impl<0UL,_OpenMD::Velocitizer_*,_std::default_delete<OpenMD::Velocitizer>_>
               .super__Head_base<0UL,_OpenMD::Velocitizer_*,_false>._M_head_impl);
    pGVar16 = this->simParams_;
  }
  if (((pGVar16->UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b == '\0') &&
     ((pGVar16->ConserveAngularMomentum).super_ParameterBase.field_0x2b == '\x01')) {
    Velocitizer::removeAngularDrift
              ((this->veloMunge_)._M_t.
               super___uniq_ptr_impl<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_>
               ._M_t.
               super__Tuple_impl<0UL,_OpenMD::Velocitizer_*,_std::default_delete<OpenMD::Velocitizer>_>
               .super__Head_base<0UL,_OpenMD::Velocitizer_*,_false>._M_head_impl);
  }
  return;
}

Assistant:

void LDForceModifier::modifyForces() {
    SimInfo::MoleculeIterator i;
    Molecule::IntegrableObjectIterator j;
    Molecule* mol;
    StuntDouble* sd;
    RealType mass;
    Vector3d pos;
    Vector3d frc;
    Mat3x3d A;
    Mat3x3d Atrans;
    Vector3d Tb;
    Vector3d ji;
    unsigned int index = 0;
    bool doLangevinForces;
    bool freezeMolecule;
    int fdf;

    fdf = 0;

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      doLangevinForces = true;
      freezeMolecule   = false;

      if (sphericalBoundaryConditions_) {
        Vector3d molPos = mol->getCom();
        RealType molRad = molPos.length();

        doLangevinForces = false;

        if (molRad > langevinBufferRadius_) {
          doLangevinForces = true;
          freezeMolecule   = false;
        }
        if (molRad > frozenBufferRadius_) {
          doLangevinForces = false;
          freezeMolecule   = true;
        }
      }

      for (sd = mol->beginIntegrableObject(j); sd != NULL;
           sd = mol->nextIntegrableObject(j)) {
        if (freezeMolecule) fdf += sd->freeze();

        if (doLangevinForces) {
          mass = sd->getMass();
          if (sd->isDirectional()) {
            // preliminaries for directional objects:

            A      = sd->getA();
            Atrans = A.transpose();

            Vector3d rcrLab = Atrans * moments_[index]->rcr;

            // apply random force and torque at center of resistance

            Vector3d randomForceBody;
            Vector3d randomTorqueBody;
            genRandomForceAndTorque(randomForceBody, randomTorqueBody, index);
            Vector3d randomForceLab  = Atrans * randomForceBody;
            Vector3d randomTorqueLab = Atrans * randomTorqueBody;

            sd->addFrc(randomForceLab);
            sd->addTrq(randomTorqueLab + cross(rcrLab, randomForceLab));

            Vector3d omegaBody;

            // What remains contains velocity explicitly, but the
            // velocity required is at the full step: v(t + h), while
            // we have initially the velocity at the half step: v(t + h/2).
            // We need to iterate to converge the friction
            // force and friction torque vectors.

            // this is the velocity at the half-step:

            Vector3d vel    = sd->getVel();
            Vector3d angMom = sd->getJ();

            // estimate velocity at full-step using everything but
            // friction forces:

            frc = sd->getFrc();

            Vector3d velStep =
                vel + (dt2_ / mass * Constants::energyConvert) * frc;

            Tb = sd->lab2Body(sd->getTrq());
            Vector3d angMomStep =
                angMom + (dt2_ * Constants::energyConvert) * Tb;

            Vector3d omegaLab;
            Vector3d vcdLab;
            Vector3d vcdBody;
            Vector3d frictionForceBody;
            Vector3d frictionForceLab(0.0);
            Vector3d oldFFL;  // used to test for convergence
            Vector3d frictionTorqueBody(0.0);
            Vector3d oldFTB;  // used to test for convergence
            Vector3d frictionTorqueLab;
            RealType fdot;
            RealType tdot;

            // iteration starts here:

            for (int k = 0; k < maxIterNum_; k++) {
              if (sd->isLinear()) {
                int linearAxis = sd->linearAxis();
                int l          = (linearAxis + 1) % 3;
                int m          = (linearAxis + 2) % 3;
                omegaBody[l]   = angMomStep[l] / moments_[index]->Icr(l, l);
                omegaBody[m]   = angMomStep[m] / moments_[index]->Icr(m, m);

              } else {
                omegaBody = moments_[index]->IcrInv * angMomStep;
                // omegaBody[0] = angMomStep[0] /I(0, 0);
                // omegaBody[1] = angMomStep[1] /I(1, 1);
                // omegaBody[2] = angMomStep[2] /I(2, 2);
              }

              omegaLab = Atrans * omegaBody;

              // apply friction force and torque at center of resistance

              vcdLab             = velStep + cross(omegaLab, rcrLab);
              vcdBody            = A * vcdLab;
              frictionForceBody  = -(hydroProps_[index]->getXitt() * vcdBody +
                                    hydroProps_[index]->getXirt() * omegaBody);
              oldFFL             = frictionForceLab;
              frictionForceLab   = Atrans * frictionForceBody;
              oldFTB             = frictionTorqueBody;
              frictionTorqueBody = -(hydroProps_[index]->getXitr() * vcdBody +
                                     hydroProps_[index]->getXirr() * omegaBody);
              frictionTorqueLab  = Atrans * frictionTorqueBody;

              // re-estimate velocities at full-step using friction forces:

              velStep = vel + (dt2_ / mass * Constants::energyConvert) *
                                  (frc + frictionForceLab);
              angMomStep = angMom + (dt2_ * Constants::energyConvert) *
                                        (Tb + frictionTorqueBody);

              // check for convergence (if the vectors have converged, fdot and
              // tdot will both be 1.0):

              fdot = dot(frictionForceLab, oldFFL) /
                     frictionForceLab.lengthSquare();
              tdot = dot(frictionTorqueBody, oldFTB) /
                     frictionTorqueBody.lengthSquare();

              if (fabs(1.0 - fdot) <= forceTolerance_ &&
                  fabs(1.0 - tdot) <= forceTolerance_)
                break;  // iteration ends here
            }

            sd->addFrc(frictionForceLab);
            sd->addTrq(frictionTorqueLab + cross(rcrLab, frictionForceLab));

          } else {
            // spherical atom

            Vector3d systemForce;
            Vector3d randomForce;
            Vector3d randomTorque;
            genRandomForceAndTorque(randomForce, randomTorque, index);
            systemForce = sd->getFrc();
            sd->addFrc(randomForce);

            // What remains contains velocity explicitly, but the
            // velocity required is at the full step: v(t + h), while
            // we have initially the velocity at the half step: v(t + h/2).
            // We need to iterate to converge the friction
            // force vector.

            // this is the velocity at the half-step:

            Vector3d vel = sd->getVel();

            // estimate velocity at full-step using everything but
            // friction forces:

            frc = sd->getFrc();
            Vector3d velStep =
                vel + (dt2_ / mass * Constants::energyConvert) * frc;

            Vector3d frictionForce(0.0);
            Vector3d oldFF;  // used to test for convergence
            RealType fdot;

            // iteration starts here:

            for (int k = 0; k < maxIterNum_; k++) {
              oldFF         = frictionForce;
              frictionForce = -hydroProps_[index]->getXitt() * velStep;

              // re-estimate velocities at full-step using friction forces:

              velStep = vel + (dt2_ / mass * Constants::energyConvert) *
                                  (frc + frictionForce);

              // check for convergence (if the vector has converged,
              // fdot will be 1.0):

              fdot = dot(frictionForce, oldFF) / frictionForce.lengthSquare();

              if (fabs(1.0 - fdot) <= forceTolerance_)
                break;  // iteration ends here
            }

            sd->addFrc(frictionForce);
          }
        }

        ++index;
      }
    }

    info_->setFdf(fdf);
    if (simParams_->getConserveLinearMomentum()) veloMunge_->removeComDrift();
    // Remove angular drift if we are not using periodic boundary conditions.
    if (!simParams_->getUsePeriodicBoundaryConditions() &&
        simParams_->getConserveAngularMomentum())
      veloMunge_->removeAngularDrift();
  }